

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_size_t mpz_abs_add(__mpz_struct *r,__mpz_struct *a,__mpz_struct *b)

{
  mp_ptr pmVar1;
  mp_limb_t mVar2;
  mp_ptr local_60;
  int local_58;
  int local_54;
  mp_size_t __mp_size_t_swap__tmp;
  mpz_srcptr __mpz_srcptr_swap__tmp;
  mp_limb_t cy;
  mp_ptr rp;
  mp_size_t bn;
  mp_size_t an;
  __mpz_struct *b_local;
  __mpz_struct *a_local;
  __mpz_struct *r_local;
  
  if (a->_mp_size < 0) {
    local_54 = -a->_mp_size;
  }
  else {
    local_54 = a->_mp_size;
  }
  bn = (mp_size_t)local_54;
  if (b->_mp_size < 0) {
    local_58 = -b->_mp_size;
  }
  else {
    local_58 = b->_mp_size;
  }
  pmVar1 = (mp_ptr)(long)local_58;
  rp = pmVar1;
  an = (mp_size_t)b;
  b_local = a;
  if (bn < (long)pmVar1) {
    rp = (mp_ptr)bn;
    bn = (mp_size_t)pmVar1;
    an = (mp_size_t)a;
    b_local = b;
  }
  if ((long)r->_mp_alloc < bn + 1) {
    local_60 = mpz_realloc(r,bn + 1);
  }
  else {
    local_60 = r->_mp_d;
  }
  mVar2 = mpn_add(local_60,b_local->_mp_d,bn,*(mp_srcptr *)(an + 8),(mp_size_t)rp);
  local_60[bn] = mVar2;
  return bn + mVar2;
}

Assistant:

static mp_size_t
mpz_abs_add (mpz_t r, const mpz_t a, const mpz_t b)
{
  mp_size_t an = GMP_ABS (a->_mp_size);
  mp_size_t bn = GMP_ABS (b->_mp_size);
  mp_ptr rp;
  mp_limb_t cy;

  if (an < bn)
    {
      MPZ_SRCPTR_SWAP (a, b);
      MP_SIZE_T_SWAP (an, bn);
    }

  rp = MPZ_REALLOC (r, an + 1);
  cy = mpn_add (rp, a->_mp_d, an, b->_mp_d, bn);

  rp[an] = cy;

  return an + cy;
}